

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void lj_record_setup(jit_State *J)

{
  char cVar1;
  IRIns *pIVar2;
  GCtrace *T;
  int32_t iVar3;
  TraceNo TVar4;
  ExitNo EVar5;
  long lVar6;
  GCproto *pGVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  J->bpropcache[0xe].key = 0;
  J->bpropcache[0xe].val = 0;
  J->bpropcache[0xe].mode = 0;
  J->bpropcache[0xf].key = 0;
  J->bpropcache[0xf].val = 0;
  J->bpropcache[0xf].mode = 0;
  J->bpropcache[0xc].key = 0;
  J->bpropcache[0xc].val = 0;
  J->bpropcache[0xc].mode = 0;
  J->bpropcache[0xd].key = 0;
  J->bpropcache[0xd].val = 0;
  J->bpropcache[0xd].mode = 0;
  J->bpropcache[10].key = 0;
  J->bpropcache[10].val = 0;
  J->bpropcache[10].mode = 0;
  J->bpropcache[0xb].key = 0;
  J->bpropcache[0xb].val = 0;
  J->bpropcache[0xb].mode = 0;
  J->bpropcache[8].key = 0;
  J->bpropcache[8].val = 0;
  J->bpropcache[8].mode = 0;
  J->bpropcache[9].key = 0;
  J->bpropcache[9].val = 0;
  J->bpropcache[9].mode = 0;
  J->bpropcache[6].key = 0;
  J->bpropcache[6].val = 0;
  J->bpropcache[6].mode = 0;
  J->bpropcache[7].key = 0;
  J->bpropcache[7].val = 0;
  J->bpropcache[7].mode = 0;
  J->bpropcache[4].key = 0;
  J->bpropcache[4].val = 0;
  J->bpropcache[4].mode = 0;
  J->bpropcache[5].key = 0;
  J->bpropcache[5].val = 0;
  J->bpropcache[5].mode = 0;
  J->bpropcache[2].key = 0;
  J->bpropcache[2].val = 0;
  J->bpropcache[2].mode = 0;
  J->bpropcache[3].key = 0;
  J->bpropcache[3].val = 0;
  J->bpropcache[3].mode = 0;
  J->bpropcache[0].key = 0;
  J->bpropcache[0].val = 0;
  J->bpropcache[0].mode = 0;
  J->bpropcache[1].key = 0;
  J->bpropcache[1].val = 0;
  J->bpropcache[1].mode = 0;
  lVar11 = 0;
  memset(J->chain,0,0x4ce);
  (J->scev).idx = 0x7fff;
  (J->scev).pc.ptr64 = 0;
  J->baseslot = 2;
  J->base = J->slot + 2;
  J->maxslot = 0;
  J->retdepth = 0;
  iVar3 = J->param[10];
  J->instunroll = J->param[9];
  J->loopunroll = iVar3;
  J->tailcalled = 0;
  J->framedepth = 0;
  J->loopref = 0;
  J->bc_min = (BCIns *)0x0;
  J->bc_extent = 0xffffffff;
  TVar4 = J->parent;
  EVar5 = J->exitno;
  (J->fold).ins.field_0.ot = 0xd09;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
  (J->fold).ins.field_0.op2 = (IRRef1)EVar5;
  lj_ir_emit(J);
  lVar6 = 0x3fffe;
  do {
    pIVar2 = (J->cur).ir;
    *(undefined4 *)((long)pIVar2 + lVar6 + -6) = 0;
    *(char *)((long)pIVar2 + lVar6 + -2) = (char)lVar11;
    *(undefined1 *)((long)pIVar2 + lVar6 + -1) = 0x16;
    *(undefined2 *)((long)pIVar2 + lVar6) = 0;
    lVar11 = lVar11 + 1;
    lVar6 = lVar6 + -8;
  } while (lVar11 != 3);
  (J->cur).nk = 0x7ffd;
  pGVar7 = (GCproto *)J->pc;
  J->startpc = (BCIns *)pGVar7;
  (J->cur).startpc.ptr64 = (uint64_t)pGVar7;
  uVar8 = J->parent;
  if ((ulong)uVar8 != 0) {
    T = (GCtrace *)J->trace[uVar8].gcptr64;
    if (T->root != 0) {
      uVar8 = (uint)T->root;
    }
    (J->cur).root = (TraceNo1)uVar8;
    (J->cur).startins = 0x58;
    if ((J->exitno == 0) && (T->snap->nent == '\0')) {
      if ((pGVar7 <= J->pt + 1) ||
         ((uVar9 = *(uint *)((long)&pGVar7[-1].varinfo.ptr64 + 4), (char)uVar9 != 'N' ||
          (*(ushort *)((long)pGVar7 + (ulong)(uVar9 >> 0x10) * 4 + -0x20002) != uVar8))))
      goto LAB_00135466;
      lj_snap_add(J);
      rec_for_loop(J,J->pc + -1,&J->scev,1);
    }
    else {
      J->startpc = (BCIns *)0x0;
LAB_00135466:
      lj_snap_replay(J,T);
    }
    if ((J->param[3] <= (int)(uint)*(ushort *)(J->trace[(J->cur).root].gcptr64 + 100)) ||
       (J->param[8] + J->param[7] <= (int)(uint)T->snap[J->exitno].count)) {
      if (((char)*J->pc == 'W') &&
         (uVar8 = *(uint *)(J->trace[*J->pc >> 0x10].gcptr64 + 0x50), (char)uVar8 == 'F')) {
        rec_itern(J,uVar8 >> 8 & 0xff,uVar8 >> 0x18);
      }
      lj_record_stop(J,LJ_TRLINK_INTERP,0);
    }
    goto LAB_001356b5;
  }
  (J->cur).root = 0;
  (J->cur).startins = (BCIns)(pGVar7->nextgc).gcptr64;
  uVar8 = (uint)(pGVar7->nextgc).gcptr64;
  if (0x18 < (uVar8 & 0xff) - 0x41) goto switchD_00135529_caseD_43;
  uVar9 = uVar8 >> 8 & 0xff;
  switch(uVar8 & 0xff) {
  case 0x41:
  case 0x42:
  case 0x45:
    goto switchD_00135529_caseD_41;
  case 0x46:
    J->maxslot = uVar9;
    J->bc_extent = (uint)*(ushort *)((long)&(pGVar7->nextgc).gcptr64 + 6) * -4 + 0x20000;
    J->bc_min = (BCIns *)((long)pGVar7 +
                         (ulong)*(ushort *)((long)&(pGVar7->nextgc).gcptr64 + 6) * 4 + -0x1fff8);
    J->state = LJ_TRACE_RECORD_1ST;
    break;
  case 0x4a:
  case 0x4b:
  case 0x4c:
    J->maxslot = ((uVar8 >> 0x10) + uVar9) - 1;
    break;
  case 0x4f:
    goto switchD_00135529_caseD_4f;
  case 0x52:
    J->maxslot = (uVar9 + *(byte *)((long)&pGVar7[-1].varinfo.ptr64 + 7)) - 1;
switchD_00135529_caseD_4f:
    uVar8 = uVar8 >> 0xe & 0xfffffffc;
    J->bc_extent = 0x20000 - uVar8;
    pGVar7 = (GCproto *)((long)pGVar7 + ((ulong)uVar8 - 0x1fffc));
    J->bc_min = (BCIns *)pGVar7;
    break;
  case 0x55:
    if (((&pGVar7[-0x4ed].firstline)[uVar8 >> 0x10] & 0x800000ffU) == 0x58) {
      uVar10 = (uint)(&pGVar7[-0x4ed].firstline)[uVar8 >> 0x10] >> 0xe & 0xfffffffc;
      J->bc_min = (BCIns *)((long)pGVar7 + ((ulong)uVar10 - 0x3fffc) + (ulong)(uVar8 >> 0x10) * 4);
      J->bc_extent = 0x20000 - uVar10;
    }
    J->maxslot = uVar9;
    goto switchD_00135529_caseD_41;
  case 0x59:
    J->maxslot = (uint)J->pt->numparams;
switchD_00135529_caseD_41:
    pGVar7 = (GCproto *)((long)&(pGVar7->nextgc).gcptr64 + 4);
  }
switchD_00135529_caseD_43:
  J->pc = (BCIns *)pGVar7;
  lj_snap_add(J);
  cVar1 = (char)(J->cur).startins;
  if (cVar1 == 'E') {
    J->startpc = (BCIns *)0x0;
  }
  else if (cVar1 == 'O') {
    rec_for_loop(J,J->pc + -1,&J->scev,1);
  }
  if (0xf8 < J->pt->framesize) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
LAB_001356b5:
  J->prev_pt = (GCproto *)0x0;
  J->prev_line = -1;
  return;
}

Assistant:

void lj_record_setup(jit_State *J)
{
  uint32_t i;

  /* Initialize state related to current trace. */
  memset(J->slot, 0, sizeof(J->slot));
  memset(J->chain, 0, sizeof(J->chain));
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  memset(J->rbchash, 0, sizeof(J->rbchash));
#endif
  memset(J->bpropcache, 0, sizeof(J->bpropcache));
  J->scev.idx = REF_NIL;
  setmref(J->scev.pc, NULL);

  J->baseslot = 1+LJ_FR2;  /* Invoking function is at base[-1-LJ_FR2]. */
  J->base = J->slot + J->baseslot;
  J->maxslot = 0;
  J->framedepth = 0;
  J->retdepth = 0;

  J->instunroll = J->param[JIT_P_instunroll];
  J->loopunroll = J->param[JIT_P_loopunroll];
  J->tailcalled = 0;
  J->loopref = 0;

  J->bc_min = NULL;  /* Means no limit. */
  J->bc_extent = ~(MSize)0;

  /* Emit instructions for fixed references. Also triggers initial IR alloc. */
  emitir_raw(IRT(IR_BASE, IRT_PGC), J->parent, J->exitno);
  for (i = 0; i <= 2; i++) {
    IRIns *ir = IR(REF_NIL-i);
    ir->i = 0;
    ir->t.irt = (uint8_t)(IRT_NIL+i);
    ir->o = IR_KPRI;
    ir->prev = 0;
  }
  J->cur.nk = REF_TRUE;

  J->startpc = J->pc;
  setmref(J->cur.startpc, J->pc);
  if (J->parent) {  /* Side trace. */
    GCtrace *T = traceref(J, J->parent);
    TraceNo root = T->root ? T->root : J->parent;
    J->cur.root = (uint16_t)root;
    J->cur.startins = BCINS_AD(BC_JMP, 0, 0);
    /* Check whether we could at least potentially form an extra loop. */
    if (J->exitno == 0 && T->snap[0].nent == 0) {
      /* We can narrow a FORL for some side traces, too. */
      if (J->pc > proto_bc(J->pt) && bc_op(J->pc[-1]) == BC_JFORI &&
	  bc_d(J->pc[bc_j(J->pc[-1])-1]) == root) {
	lj_snap_add(J);
	rec_for_loop(J, J->pc-1, &J->scev, 1);
	goto sidecheck;
      }
    } else {
      J->startpc = NULL;  /* Prevent forming an extra loop. */
    }
    lj_snap_replay(J, T);
  sidecheck:
    if ((traceref(J, J->cur.root)->nchild >= J->param[JIT_P_maxside] ||
	 T->snap[J->exitno].count >= J->param[JIT_P_hotexit] +
				     J->param[JIT_P_tryside])) {
      if (bc_op(*J->pc) == BC_JLOOP) {
	BCIns startins = traceref(J, bc_d(*J->pc))->startins;
	if (bc_op(startins) == BC_ITERN)
	  rec_itern(J, bc_a(startins), bc_b(startins));
      }
      lj_record_stop(J, LJ_TRLINK_INTERP, 0);
    }
  } else {  /* Root trace. */
    J->cur.root = 0;
    J->cur.startins = *J->pc;
    J->pc = rec_setup_root(J);
    /* Note: the loop instruction itself is recorded at the end and not
    ** at the start! So snapshot #0 needs to point to the *next* instruction.
    ** The one exception is BC_ITERN, which sets LJ_TRACE_RECORD_1ST.
    */
    lj_snap_add(J);
    if (bc_op(J->cur.startins) == BC_FORL)
      rec_for_loop(J, J->pc-1, &J->scev, 1);
    else if (bc_op(J->cur.startins) == BC_ITERC)
      J->startpc = NULL;
    if (1 + J->pt->framesize >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
  }
#if LJ_HASPROFILE
  J->prev_pt = NULL;
  J->prev_line = -1;
#endif
#ifdef LUAJIT_ENABLE_CHECKHOOK
  /* Regularly check for instruction/line hooks from compiled code and
  ** exit to the interpreter if the hooks are set.
  **
  ** This is a compile-time option and disabled by default, since the
  ** hook checks may be quite expensive in tight loops.
  **
  ** Note this is only useful if hooks are *not* set most of the time.
  ** Use this only if you want to *asynchronously* interrupt the execution.
  **
  ** You can set the instruction hook via lua_sethook() with a count of 1
  ** from a signal handler or another native thread. Please have a look
  ** at the first few functions in luajit.c for an example (Ctrl-C handler).
  */
  {
    TRef tr = emitir(IRT(IR_XLOAD, IRT_U8),
		     lj_ir_kptr(J, &J2G(J)->hookmask), IRXLOAD_VOLATILE);
    tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (LUA_MASKLINE|LUA_MASKCOUNT)));
    emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, 0));
  }
#endif
}